

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O3

void __thiscall MemMat<int>::MemMat(MemMat<int> *this,Size *size)

{
  Size SVar1;
  Mat aMStack_a8 [96];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  cv::Mat::Mat(&(this->img_).super_Mat);
  *(uint *)&this->img_ = *(uint *)&this->img_ & 0xfffff000 | 4;
  cv::Mat::Mat(&(this->accesses_).super_Mat);
  *(uint *)&this->accesses_ = *(uint *)&this->accesses_ & 0xfffff000 | 4;
  cv::Mat::Mat(aMStack_a8,size->height,size->width,4);
  cv::Mat::operator=(&(this->img_).super_Mat,aMStack_a8);
  cv::Mat::~Mat(aMStack_a8);
  cv::Mat::Mat(aMStack_a8,size->height,size->width,4);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  cv::Mat::operator=(aMStack_a8,(Scalar_ *)&local_48);
  cv::Mat::operator=(&(this->accesses_).super_Mat,aMStack_a8);
  cv::Mat::~Mat(aMStack_a8);
  SVar1 = *size;
  this->rows = SVar1.height;
  this->cols = SVar1.width;
  return;
}

Assistant:

MemMat(cv::Size size)
    {
        img_ = cv::Mat_<T>(size);
        accesses_ = cv::Mat1i(size, 0);
        rows = size.height;
        cols = size.width;
    }